

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ql_noderel.cc
# Opt level: O3

RC __thiscall QL_NodeRel::GetNextRec(QL_NodeRel *this,RM_Record *rec)

{
  RC RVar1;
  char *recData;
  char *pcStack_8;
  
  RVar1 = RetrieveNextRec(this,rec,&pcStack_8);
  if ((RVar1 == 0xd3) || (RVar1 == 0x6e)) {
    RVar1 = 0x199;
  }
  return RVar1;
}

Assistant:

RC QL_NodeRel::GetNextRec(RM_Record &rec){
  RC rc = 0;
  char *recData;
  if((rc = RetrieveNextRec(rec, recData))){
    if(rc == RM_EOF || rc == IX_EOF)
      return (QL_EOI);
    return (rc);
  }
  return (0);
}